

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

class_<sophia_interface,_std::shared_ptr<sophia_interface>_> * __thiscall
pybind11::class_<sophia_interface,std::shared_ptr<sophia_interface>>::
def<sophiaevent_output(sophia_interface::*)(bool,double,double,bool),pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg_v>
          (class_<sophia_interface,std::shared_ptr<sophia_interface>> *this,char *name_,
          offset_in_sophia_interface_to_subr *f,arg *extra,arg *extra_1,arg *extra_2,arg_v *extra_3)

{
  offset_in_sophia_interface_to_subr f_00;
  name *extra_00;
  handle local_d8;
  PyObject *local_d0;
  obj_attr_accessor local_c8;
  offset_in_sophia_interface_to_subr local_a8;
  handle local_88;
  PyObject *local_80;
  handle local_78;
  handle local_70;
  undefined1 local_68 [16];
  is_method local_58;
  void *local_50;
  offset_in_sophia_interface_to_subr local_48;
  cpp_function local_40;
  cpp_function cf;
  arg *extra_local_2;
  arg *extra_local_1;
  arg *extra_local;
  offset_in_sophia_interface_to_subr *f_local;
  char *name__local;
  class_<sophia_interface,_std::shared_ptr<sophia_interface>_> *this_local;
  
  local_50 = (void *)*f;
  local_48 = f[1];
  cf.super_function.super_object.super_handle.m_ptr = (function)(function)extra_2;
  f_00 = _sophia_interface___pybind11__method_adaptor<sophia_interface,sophiaevent_output,sophia_interface,bool,double,double,bool>_sophiaevent_output_sophia_interface_____bool_double_double_bool___
                   (local_50,local_48);
  pybind11::name::name((name *)&local_58,name_);
  is_method::is_method((is_method *)(local_68 + 8),(handle *)this);
  local_78.m_ptr = *(PyObject **)this;
  none::none((none *)&local_88);
  local_80 = local_88.m_ptr;
  getattr((pybind11 *)&local_70,local_78,name_,local_88);
  sibling::sibling((sibling *)local_68,&local_70);
  local_a8 = f_00;
  cpp_function::
  cpp_function<sophiaevent_output,sophia_interface,bool,double,double,bool,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg_v>
            (&local_40,f_00,extra_00,&local_58,(sibling *)(local_68 + 8),(arg *)local_68,extra,
             extra_1,(arg_v *)cf.super_function.super_object.super_handle.m_ptr);
  object::~object((object *)&local_70);
  none::~none((none *)&local_88);
  cpp_function::name((cpp_function *)&local_d8);
  local_d0 = local_d8.m_ptr;
  detail::object_api<pybind11::handle>::attr
            (&local_c8,(object_api<pybind11::handle> *)this,local_d8);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::operator=(&local_c8,&local_40);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::~accessor(&local_c8);
  object::~object((object *)&local_d8);
  cpp_function::~cpp_function(&local_40);
  return (class_<sophia_interface,_std::shared_ptr<sophia_interface>_> *)this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        attr(cf.name()) = cf;
        return *this;
    }